

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupAssignmentRecord.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::DATA_TYPE::GroupAssignmentRecord::IsGroupBitSet(GroupAssignmentRecord *this,KUINT8 Group)

{
  bool bVar1;
  KException *this_00;
  bitset<32UL> local_58;
  bitset<32UL> bits;
  allocator<char> local_39;
  KString local_38;
  byte local_11;
  GroupAssignmentRecord *pGStack_10;
  KUINT8 Group_local;
  GroupAssignmentRecord *this_local;
  
  local_11 = Group;
  pGStack_10 = this;
  if (0x1f < Group) {
    bits.super__Base_bitset<1UL>._M_w._3_1_ = 1;
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"IsGroupBitSet",&local_39);
    KException::KException(this_00,&local_38,7);
    bits.super__Base_bitset<1UL>._M_w._3_1_ = 0;
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  std::bitset<32UL>::bitset(&local_58,(long)(int)this->m_ui32GrpBtField);
  bVar1 = std::bitset<32UL>::test(&local_58,(ulong)local_11);
  return bVar1;
}

Assistant:

KBOOL GroupAssignmentRecord::IsGroupBitSet(KUINT8 Group) const noexcept(false)
{
    if( Group > 31 )throw KException( __FUNCTION__, OUT_OF_BOUNDS );

    const bitset<32> bits( ( KINT32 )m_ui32GrpBtField ); // We need to cast to a signed int, this is a visual studio 2010 fix
    return bits.test( Group );
}